

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O0

float ncnn::get_indexed_value(Mat *m,string *token,vector<int,_std::allocator<int>_> *indexes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  int x_3;
  int y_2;
  int z;
  int c_1;
  int x_2;
  int y_1;
  int c;
  int x_1;
  int y;
  int x;
  int dims;
  Mat *m_2;
  Mat *m_1;
  float local_20c;
  
  iVar1 = (int)in_RDI[5];
  if (iVar1 == 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    local_20c = *(float *)(*in_RDI + (long)*pvVar5 * 4);
  }
  else if (iVar1 == 2) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    iVar1 = *pvVar5;
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    local_20c = *(float *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)iVar1 * in_RDI[2] +
                          (long)*pvVar5 * 4);
  }
  else if (iVar1 == 3) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    iVar1 = *pvVar5;
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    iVar2 = *pvVar5;
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    local_20c = *(float *)(*in_RDI + in_RDI[8] * (long)iVar1 * in_RDI[2] +
                           (long)*(int *)((long)in_RDI + 0x2c) * (long)iVar2 * in_RDI[2] +
                          (long)*pvVar5 * 4);
  }
  else if (iVar1 == 4) {
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    iVar1 = *pvVar5;
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    iVar2 = *pvVar5;
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    iVar3 = *pvVar5;
    pcVar4 = (char *)std::__cxx11::string::operator[](in_RSI);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)(*pcVar4 + -0x69));
    local_20c = *(float *)(*in_RDI + in_RDI[8] * (long)iVar1 * in_RDI[2] +
                           (long)*(int *)((long)in_RDI + 0x2c) * (long)(int)in_RDI[6] * (long)iVar2
                           * in_RDI[2] +
                           (long)*(int *)((long)in_RDI + 0x2c) * (long)iVar3 * in_RDI[2] +
                          (long)*pvVar5 * 4);
  }
  else {
    local_20c = 0.0;
  }
  return local_20c;
}

Assistant:

static float get_indexed_value(const Mat& m, const std::string& token, std::vector<int>& indexes)
{
    const int dims = m.dims;

    if (dims == 1)
    {
        int x = indexes[token[0] - 'i'];
        return m[x];
    }

    if (dims == 2)
    {
        int y = indexes[token[0] - 'i'];
        int x = indexes[token[1] - 'i'];
        return m.row(y)[x];
    }

    if (dims == 3)
    {
        int c = indexes[token[0] - 'i'];
        int y = indexes[token[1] - 'i'];
        int x = indexes[token[2] - 'i'];
        return m.channel(c).row(y)[x];
    }

    if (dims == 4)
    {
        int c = indexes[token[0] - 'i'];
        int z = indexes[token[1] - 'i'];
        int y = indexes[token[2] - 'i'];
        int x = indexes[token[3] - 'i'];
        return m.channel(c).depth(z).row(y)[x];
    }

    // should never reach here
    return 0;
}